

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O1

void __thiscall CTcEmbedTokenList::reduce(CTcEmbedTokenList *this,CTcStrTemplate *tpl)

{
  int iVar1;
  int iVar2;
  CTcTokenEle *pCVar3;
  int iVar4;
  CTcTokenEle *pCVar5;
  CTcTokenEle *src;
  bool bVar6;
  
  pCVar5 = this->head;
  iVar1 = this->cnt;
  iVar4 = tpl->cnt;
  pCVar3 = tpl->head;
  src = pCVar5;
  if (pCVar3 != (CTcTokenEle *)0x0 && pCVar5 != (CTcTokenEle *)0x0) {
    while (((pCVar3->super_CTcToken).text_len_ != 1 || (*(pCVar3->super_CTcToken).text_ != '*'))) {
      src = src->nxt_;
      iVar1 = iVar1 + -1;
      iVar4 = iVar4 + -1;
      if ((src == (CTcTokenEle *)0x0) || (pCVar3 = pCVar3->nxt_, pCVar3 == (CTcTokenEle *)0x0))
      break;
    }
  }
  iVar2 = (iVar1 - iVar4) + 1;
  this->cnt = iVar2;
  if (((src != pCVar5) && (src != (CTcTokenEle *)0x0)) && (iVar2 != 0)) {
    iVar1 = iVar4 - iVar1;
    do {
      CTcTokenizer::copytok(G_tok,&pCVar5->super_CTcToken,&src->super_CTcToken);
      src = src->nxt_;
      if (src == (CTcTokenEle *)0x0) break;
      pCVar5 = pCVar5->nxt_;
      bVar6 = iVar1 != 0;
      iVar1 = iVar1 + 1;
    } while (bVar6);
  }
  pCVar5 = this->head;
  this->wrt = pCVar5;
  for (iVar1 = this->cnt; iVar1 != 0; iVar1 = iVar1 + -1) {
    pCVar5 = pCVar5->nxt_;
    this->wrt = pCVar5;
  }
  return;
}

Assistant:

void reduce(CTcStrTemplate *tpl)
    {
        /* find the first token in our list matching '*' in the template */
        CTcTokenEle *src, *tele;
        int rem, trem;
        for (src = head, tele = tpl->head, rem = cnt, trem = tpl->cnt ;
             src != 0 && tele != 0 ;
             src = src->getnxt(), tele = tele->getnxt(), --rem, --trem)
        {
            /* stop when we reach '*' in the template */
            if (tele->text_matches("*", 1))
                break;
        }

        /* skip the '*' in the template */
        trem -= 1;

        /* 
         *   The number of tokens matching '*' is the number left in our
         *   list, minus the number left in the token list after the '*'.
         */
        rem -= trem;
        cnt = rem;

        /* if we had any leading fixed tokens to remove, remove them */
        if (src != head)
        {
            CTcTokenEle *dst;
            for (dst = head ; rem != 0 && src != 0 ;
                 src = src->getnxt(), dst = dst->getnxt(), --rem)
            {
                /* copy this token */
                G_tok->copytok(dst, src);
            }
        }

        /* move the write pointer to the proper position */
        for (wrt = head, rem = cnt ; rem != 0 ; wrt = wrt->getnxt(), --rem) ;
    }